

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

wchar_t * fmt::v6::internal::
          parse_arg_id<wchar_t,fmt::v6::internal::id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,wchar_t,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&,wchar_t>>
                    (wchar_t *begin,wchar_t *end,
                    id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
                    *handler)

{
  long lVar1;
  wchar_t *pwVar2;
  wchar_t wVar3;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *pfVar4;
  int id;
  long lVar5;
  error_handler *begin_00;
  basic_string_view<wchar_t> name;
  wchar_t *local_40;
  anon_union_16_15_055d57a1_for_value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_1
  local_38;
  type local_28;
  
  wVar3 = *begin;
  local_40 = begin;
  if ((wVar3 == L'}') || (wVar3 == L':')) {
    format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
    ::on_arg_id(handler->handler);
  }
  else if ((uint)(wVar3 + L'\xffffffd0') < 10) {
    begin_00 = (error_handler *)&local_40;
    id = parse_nonnegative_int<wchar_t,fmt::v6::internal::id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,wchar_t,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&,wchar_t>&>
                   ((wchar_t **)begin_00,end,handler);
    begin = (wchar_t *)begin_00;
    if ((local_40 == end) || ((*local_40 != L':' && (*local_40 != L'}')))) {
LAB_0018feff:
      error_handler::on_error((error_handler *)begin,"invalid format string");
    }
    format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
    ::on_arg_id(handler->handler,id);
  }
  else {
    if ((wVar3 != L'_') && (0x19 < (uint)((wVar3 & 0xffffffdfU) - 0x41U))) goto LAB_0018feff;
    lVar1 = 4;
    do {
      lVar5 = lVar1;
      pwVar2 = (wchar_t *)((long)begin + lVar5);
      if (pwVar2 == end) break;
      wVar3 = *pwVar2;
      lVar1 = lVar5 + 4;
    } while ((((uint)(wVar3 + L'\xffffffd0') < 10) || (wVar3 == L'_')) ||
            ((uint)((wVar3 & 0xffffffdfU) - 0x41U) < 0x1a));
    name.size_ = lVar5 >> 2;
    pfVar4 = handler->handler;
    name.data_ = begin;
    basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>::
    arg((format_arg *)&local_38.string,&pfVar4->context,name);
    (pfVar4->arg).type_ = local_28;
    (pfVar4->arg).value_.field_0.long_long_value = local_38.long_long_value;
    (pfVar4->arg).value_.field_0.string.size = local_38.string.size;
    local_40 = pwVar2;
  }
  return local_40;
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}